

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntBounds.cpp
# Opt level: O0

bool __thiscall IntBounds::IsGreaterThanOrEqualTo(IntBounds *this,int constantBoundBase,int offset)

{
  bool bVar1;
  int offset_local;
  int constantBoundBase_local;
  IntBounds *this_local;
  
  bVar1 = IsGreaterThanOrEqualTo(this->constantLowerBound,constantBoundBase,offset);
  return bVar1;
}

Assistant:

bool IntBounds::IsGreaterThanOrEqualTo(const int constantBoundBase, const int offset) const
{
    return IsGreaterThanOrEqualTo(constantLowerBound, constantBoundBase, offset);
}